

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array<Imf_3_4::Array2D<Imath_3_2::half>_>::resizeErase
          (Array<Imf_3_4::Array2D<Imath_3_2::half>_> *this,long size)

{
  Array2D<Imath_3_2::half> *pAVar1;
  half *phVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = size;
  uVar4 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar5 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar5 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  plVar6 = (long *)operator_new__(uVar5);
  *plVar6 = size;
  if (size != 0) {
    memset((Array2D<Imath_3_2::half> *)(plVar6 + 1),0,
           ((uVar4 - 0x18) - (uVar4 - 0x18) % 0x18) + 0x18);
  }
  pAVar1 = this->_data;
  if (pAVar1 != (Array2D<Imath_3_2::half> *)0x0) {
    phVar2 = pAVar1[-1]._data;
    if (phVar2 != (half *)0x0) {
      lVar7 = (long)phVar2 * 0x18;
      do {
        Array2D<Imath_3_2::half>::~Array2D
                  ((Array2D<Imath_3_2::half> *)((long)&pAVar1[-1]._sizeX + lVar7));
        lVar7 = lVar7 + -0x18;
      } while (lVar7 != 0);
    }
    operator_delete__(&pAVar1[-1]._data,(long)phVar2 * 0x18 + 8);
  }
  this->_size = size;
  this->_data = (Array2D<Imath_3_2::half> *)(plVar6 + 1);
  return;
}

Assistant:

inline void
Array<T>::resizeErase (long size)
{
    T* tmp = new T[size];
    delete[] _data;
    _size = size;
    _data = tmp;
}